

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

termline * newtermline(Terminal *term,wchar_t cols,_Bool bce)

{
  undefined4 uVar1;
  termline *ptVar2;
  termchar *ptVar3;
  wchar_t local_24;
  wchar_t j;
  termline *line;
  _Bool bce_local;
  wchar_t cols_local;
  Terminal *term_local;
  
  ptVar2 = (termline *)safemalloc(1,0x28,0);
  ptVar3 = (termchar *)safemalloc((long)cols,0x20,0);
  ptVar2->chars = ptVar3;
  for (local_24 = L'\0'; local_24 < cols; local_24 = local_24 + L'\x01') {
    ptVar3 = ptVar2->chars + local_24;
    if (bce) {
      ptVar3->chr = (term->erase_char).chr;
      ptVar3->attr = (term->erase_char).attr;
      ptVar3->truecolour = (term->erase_char).truecolour;
      uVar1 = *(undefined4 *)&(term->erase_char).field_0x1c;
      ptVar3->cc_next = (term->erase_char).cc_next;
      *(undefined4 *)&ptVar3->field_0x1c = uVar1;
    }
    else {
      ptVar3->chr = (term->basic_erase_char).chr;
      ptVar3->attr = (term->basic_erase_char).attr;
      ptVar3->truecolour = (term->basic_erase_char).truecolour;
      uVar1 = *(undefined4 *)&(term->basic_erase_char).field_0x1c;
      ptVar3->cc_next = (term->basic_erase_char).cc_next;
      *(undefined4 *)&ptVar3->field_0x1c = uVar1;
    }
  }
  ptVar2->size = cols;
  ptVar2->cols = cols;
  ptVar2->lattr = 0;
  ptVar2->trusted = false;
  ptVar2->temporary = false;
  ptVar2->cc_free = L'\0';
  return ptVar2;
}

Assistant:

static termline *newtermline(Terminal *term, int cols, bool bce)
{
    termline *line;
    int j;

    line = snew(termline);
    line->chars = snewn(cols, termchar);
    for (j = 0; j < cols; j++)
        line->chars[j] = (bce ? term->erase_char : term->basic_erase_char);
    line->cols = line->size = cols;
    line->lattr = LATTR_NORM;
    line->trusted = false;
    line->temporary = false;
    line->cc_free = 0;

    return line;
}